

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_ParmParse.cpp
# Opt level: O2

void __thiscall amrex::ParmParse::ParmParse(ParmParse *this,Table *a_table)

{
  allocator local_31;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  std::
  stack<std::__cxx11::string,std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
  ::stack<std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>,void>
            (&this->m_pstack);
  this->m_table = a_table;
  std::__cxx11::string::string((string *)&local_30,"",&local_31);
  std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((deque<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

ParmParse::ParmParse (Table& a_table)
    : m_table(a_table)
{
    m_pstack.push("");
}